

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score_function.h
# Opt level: O3

void __thiscall
xLearn::Score::Initialize
          (Score *this,real_t learning_rate,real_t regu_lambda,real_t alpha,real_t beta,
          real_t lambda_1,real_t lambda_2,string *opt_type)

{
  this->learning_rate_ = learning_rate;
  this->regu_lambda_ = regu_lambda;
  this->alpha_ = alpha;
  this->beta_ = beta;
  this->lambda_1_ = lambda_1;
  this->lambda_2_ = lambda_2;
  std::__cxx11::string::_M_assign((string *)&this->opt_type_);
  return;
}

Assistant:

virtual void Initialize(real_t learning_rate,
                          real_t regu_lambda,
                          real_t alpha,
                          real_t beta,
                          real_t lambda_1,
                          real_t lambda_2,
                          std::string& opt_type) {
    learning_rate_ = learning_rate;
    regu_lambda_ = regu_lambda;
    alpha_ = alpha;
    beta_ = beta;
    lambda_1_ = lambda_1;
    lambda_2_ = lambda_2;
    opt_type_ = opt_type;
  }